

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_cycleselect(_glist *x,t_float foffset)

{
  int iVar1;
  int iVar2;
  int iVar3;
  _glist *p_Var4;
  t_gobj *y_00;
  bool bVar5;
  double dVar6;
  t_gobj *local_140;
  t_object *local_130;
  t_object *local_128;
  int sinkno;
  int srcno;
  _outconnect *oc;
  t_linetraverser t;
  int foundit;
  int connectioncount;
  t_gobj *y;
  int objectcount;
  int newindex;
  int nios_1;
  int closest_1;
  int hotspot_1;
  int width_1;
  int nios;
  int closest;
  int hotspot;
  int width;
  int snkY2;
  int snkX2;
  int snkY1;
  int snkX1;
  int srcY2;
  int srcX2;
  int srcY1;
  int srcX1;
  t_gobj *gobj;
  t_object *snk;
  t_object *src;
  int ypos;
  int xpos;
  int ywas;
  int xwas;
  int offset;
  t_float foffset_local;
  _glist *x_local;
  
  ywas = (int)foffset;
  if (x->gl_editor != (t_editor *)0x0) {
    xwas = (int)foffset;
    _offset = x;
    if ((x->gl_editor->field_0x88 & 7) == 2) {
      xpos = x->gl_editor->e_xwas;
      ypos = x->gl_editor->e_ywas;
      src._4_4_ = *(int *)((pd_maininstance.pd_gui)->i_editor + 0x80);
      src._0_4_ = *(uint *)((pd_maininstance.pd_gui)->i_editor + 0x84);
      srcX2 = 0;
      srcY2 = 0;
      snkX1 = 0;
      snkY1 = 0;
      snkX2 = 0;
      snkY2 = 0;
      width = 0;
      hotspot = 0;
      if (*(_glist **)((pd_maininstance.pd_gui)->i_editor + 0x78) == x) {
        _srcY1 = canvas_findhitbox(x,xpos,ypos,&srcX2,&srcY2,&snkX1,&snkY1);
        if (_srcY1 == (t_gobj *)0x0) {
          local_128 = (t_object *)0x0;
        }
        else {
          local_128 = pd_checkobject(&_srcY1->g_pd);
        }
        snk = local_128;
        _srcY1 = canvas_findhitbox(_offset,src._4_4_,(uint)src,&snkX2,&snkY2,&width,&hotspot);
        if (_srcY1 == (t_gobj *)0x0) {
          local_130 = (t_object *)0x0;
        }
        else {
          local_130 = pd_checkobject(&_srcY1->g_pd);
        }
        gobj = &local_130->te_g;
        if (snk != (t_object *)0x0) {
          if ((local_130 == (t_object *)0x0) || (local_130 == snk)) {
            iVar1 = snkX1 - srcX2;
            iVar2 = obj_noutlets(snk);
            if (1 < iVar2) {
              _offset->gl_editor->e_xwas =
                   (int)((double)srcX2 +
                         (double)((iVar1 + -7) *
                                 (((((xpos - srcX2) * (iVar2 + -1) + iVar1 / 2) / iVar1 + ywas) %
                                   iVar2 + iVar2) % iVar2)) / ((double)iVar2 - 1.0) + 3.5);
              canvas_doconnect(_offset,src._4_4_,(uint)src,0,0);
            }
          }
          else {
            iVar1 = width - snkX2;
            iVar2 = obj_ninlets(local_130);
            if (1 < iVar2) {
              iVar3 = ((src._4_4_ - snkX2) * (iVar2 + -1) + iVar1 / 2) / iVar1 + ywas;
              dVar6 = (double)snkX2;
              p_Var4 = glist_getcanvas(_offset);
              pdgui_vmess("::pdtk_canvas::setmouse","cii",p_Var4,
                          (ulong)(uint)(int)(dVar6 + (double)((iVar1 + -7) *
                                                             ((iVar3 % iVar2 + iVar2) % iVar2)) /
                                                     ((double)iVar2 - 1.0) + 3.5),(ulong)(uint)src);
            }
          }
        }
      }
    }
    else if (x->gl_editor->e_selection == (t_selection *)0x0) {
      if (((byte)x->gl_editor->field_0x88 >> 5 & 1) != 0) {
        t._116_4_ = 0;
        t.tr_nextoutno = 0;
        _sinkno = (_outconnect *)0x0;
        linetraverser_start((t_linetraverser *)&oc,x);
        while( true ) {
          bVar5 = false;
          if (ywas != 0) {
            _sinkno = linetraverser_next((t_linetraverser *)&oc);
            bVar5 = _sinkno != (_outconnect *)0x0;
          }
          if (!bVar5) break;
          t._116_4_ = t._116_4_ + 1;
          if (t.tr_nextoutno == 0) {
            iVar1 = glist_getindex(_offset,(t_gobj *)t.tr_x);
            iVar2 = glist_getindex(_offset,(t_gobj *)t._16_8_);
            if ((((iVar1 == _offset->gl_editor->e_selectline_index1) &&
                 (t.tr_ob._4_4_ == _offset->gl_editor->e_selectline_outno)) &&
                (iVar2 == _offset->gl_editor->e_selectline_index2)) &&
               (t.tr_inlet._4_4_ == _offset->gl_editor->e_selectline_inno)) {
              t.tr_nextoutno = t._116_4_;
            }
          }
          else {
            ywas = ywas + -1;
          }
        }
        if (t._116_4_ == 0) {
          ywas = 0;
        }
        if (ywas != 0) {
          ywas = ((ywas + -1) % (int)t._116_4_ + t._116_4_) % (int)t._116_4_;
          linetraverser_start((t_linetraverser *)&oc,_offset);
          while ((_sinkno = linetraverser_next((t_linetraverser *)&oc),
                 _sinkno != (_outconnect *)0x0 && (ywas != 0))) {
            ywas = ywas + -1;
          }
        }
        p_Var4 = _offset;
        if (_sinkno != (_outconnect *)0x0) {
          iVar1 = glist_getindex(_offset,(t_gobj *)t.tr_x);
          iVar2 = glist_getindex(_offset,(t_gobj *)t._16_8_);
          glist_selectline(p_Var4,_sinkno,iVar1,t.tr_ob._4_4_,iVar2,t.tr_inlet._4_4_);
        }
      }
    }
    else {
      iVar1 = glist_getindex(x,(t_gobj *)0x0);
      if (_offset->gl_editor->e_selection->sel_next == (_selection *)0x0) {
        local_140 = _offset->gl_editor->e_selection->sel_what;
      }
      else {
        local_140 = (t_gobj *)0x0;
      }
      if ((local_140 != (t_gobj *)0x0) && (iVar1 != 0)) {
        iVar2 = glist_getindex(_offset,local_140);
        y._4_4_ = (iVar2 + ywas) % iVar1;
        if (y._4_4_ < 0) {
          y._4_4_ = iVar1 + y._4_4_;
        }
        glist_deselect(_offset,local_140);
        p_Var4 = _offset;
        y_00 = glist_nth(_offset,y._4_4_);
        glist_select(p_Var4,y_00);
      }
    }
  }
  return;
}

Assistant:

static void canvas_cycleselect(t_canvas*x, t_float foffset)
{
        /* select (currentselection+offset)%objectcount */
    int offset = (int)foffset;
    if (!x->gl_editor)
        return;

    if (x->gl_editor->e_onmotion == MA_CONNECT)
    {
            /* during connection, cycle through inlets/outlets */
        int xwas = x->gl_editor->e_xwas,
            ywas = x->gl_editor->e_ywas;
        int xpos = EDITOR->canvas_last_glist_x,
            ypos = EDITOR->canvas_last_glist_y;
        t_object *src, *snk;
        t_gobj*gobj;
        int srcX1=0, srcY1=0, srcX2=0, srcY2=0;
        int snkX1=0, snkY1=0, snkX2=0, snkY2=0;
        if(EDITOR->canvas_last_glist != x)
                /* we don't know the current mouse coordinates in this canvas, so return... */
            return;
        gobj = canvas_findhitbox(x, xwas, ywas, &srcX1, &srcY1, &srcX2, &srcY2);
        src = gobj?pd_checkobject(&gobj->g_pd):0;
        gobj = canvas_findhitbox(x, xpos, ypos, &snkX1, &snkY1, &snkX2, &snkY2);
        snk = gobj?pd_checkobject(&gobj->g_pd):0;

        if(!src) /* this should never happen */
            return;

            /* are we hovering over an object?
             * - if so, cycle through inlets
             * - else, cycle through outlets
             */
        if(snk && snk != src) {
                /* cycle inlets */
            int width = snkX2 - snkX1, hotspot, closest;
            int nios = obj_ninlets(snk);
            if (nios <= 1) /* no use cycling */
                return;
            closest = ((xpos-snkX1) * (nios-1) + width/2)/width;
            closest = ((closest + offset) % nios + nios) % nios;
            hotspot = snkX1 + (width - IOWIDTH) * closest / (nios-1.0) + IOWIDTH*0.5;
            pdgui_vmess("::pdtk_canvas::setmouse", "cii",  glist_getcanvas(x), hotspot, ypos);
        } else {
                /* cycle outlets */
            int width = srcX2 - srcX1, hotspot, closest;
            int nios = obj_noutlets(src);
            if (nios <= 1) /* no use cycling */
                return;
            closest = ((xwas-srcX1) * (nios-1) + width/2)/width;
            closest = ((closest + offset) % nios + nios) % nios;
            hotspot = srcX1 + (width - IOWIDTH) * closest / (nios-1.0) + IOWIDTH*0.5;
            x->gl_editor->e_xwas = hotspot;
            canvas_doconnect(x, xpos, ypos, 0, 0);
        }
        return;
    }
    if (x->gl_editor->e_selection)
    {
            /* cycle the selection to the next object */
        int newindex;
        int objectcount = glist_getindex(x, 0);
            /* only cycle selection if the current selection contains exactly 1 item */
        t_gobj* y = x->gl_editor->e_selection->sel_next ? 0 : x->gl_editor->e_selection->sel_what;
        if (!y || !objectcount)
            return;
        newindex = (glist_getindex(x, y) + offset) % objectcount;
        if (newindex < 0) newindex += objectcount;
        glist_deselect(x, y);
        glist_select(x, glist_nth(x, newindex));
        return;
    }
    if (x->gl_editor->e_selectedline)
    {
            /* if (only) a line is selected, cycle to next line */
        int connectioncount = 0;
        int foundit = 0;
        t_linetraverser t;
        t_outconnect *oc = 0;

        linetraverser_start(&t, x);
        while (offset && (oc = linetraverser_next(&t)))
        {
            connectioncount++;
            if(!foundit) {
                int srcno = glist_getindex(x, &t.tr_ob->ob_g);
                int sinkno = glist_getindex(x, &t.tr_ob2->ob_g);
                if((srcno      == x->gl_editor->e_selectline_index1) &&
                    (t.tr_outno == x->gl_editor->e_selectline_outno) &&
                    (sinkno     == x->gl_editor->e_selectline_index2) &&
                    (t.tr_inno  == x->gl_editor->e_selectline_inno)) {
                    foundit = connectioncount;
                }
            } else
                offset--;
        }

        if (!connectioncount)
            offset = 0;

            /* if the offset is non-0, wrap it... */
        if (offset)
        {
            offset = (((offset - 1) % connectioncount) + connectioncount)
                % connectioncount;
            /* ... and start from the beginning */
            linetraverser_start(&t, x);
            while ((oc = linetraverser_next(&t)))
            {
                if(!offset)break;
                offset--;
            }
        }
        if (oc)
            glist_selectline(x, oc,
                glist_getindex(x, &t.tr_ob->ob_g), t.tr_outno,
                glist_getindex(x, &t.tr_ob2->ob_g), t.tr_inno);
        return;
    }
}